

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O1

char * __thiscall QByteArray::data(QByteArray *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    reallocData(this,(this->d).size,KeepSize);
  }
  return (this->d).ptr;
}

Assistant:

inline char *QByteArray::data()
{
    detach();
    Q_ASSERT(d.data());
    return d.data();
}